

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

CRollingBloomFilter * __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::RecentRejectsFilter(PeerManagerImpl *this)

{
  bool bVar1;
  type pCVar2;
  unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *in_RDI;
  long in_FS_OFFSET;
  int *unaff_retaddr;
  unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>
  *in_stack_ffffffffffffffc8;
  unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *this_00;
  double *__args_1;
  
  __args_1 = *(double **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_RDI,(char *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (AnnotatedMixin<std::mutex> *)0x10799d0);
  bVar1 = std::unique_ptr::operator_cast_to_bool(in_stack_ffffffffffffffc8);
  if (!bVar1) {
    std::make_unique<CRollingBloomFilter,int,double>(unaff_retaddr,__args_1);
    std::unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::operator=
              (this_00,in_RDI);
    std::unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::~unique_ptr
              (this_00);
  }
  pCVar2 = std::unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::
           operator*(this_00);
  if (*(double **)(in_FS_OFFSET + 0x28) == __args_1) {
    return pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(m_tx_download_mutex)
    {
        AssertLockHeld(m_tx_download_mutex);

        if (!m_lazy_recent_rejects) {
            m_lazy_recent_rejects = std::make_unique<CRollingBloomFilter>(120'000, 0.000'001);
        }

        return *m_lazy_recent_rejects;
    }